

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disk_interface.hpp
# Opt level: O1

storage_holder * __thiscall
libtorrent::storage_holder::operator=(storage_holder *this,storage_holder *rhs)

{
  disk_interface *pdVar1;
  
  if (rhs != this) {
    pdVar1 = this->m_disk_io;
    if (pdVar1 != (disk_interface *)0x0) {
      (*pdVar1->_vptr_disk_interface[1])(pdVar1,(ulong)(this->m_idx).m_val);
    }
    this->m_disk_io = rhs->m_disk_io;
    (this->m_idx).m_val = (rhs->m_idx).m_val;
    rhs->m_disk_io = (disk_interface *)0x0;
  }
  return this;
}

Assistant:

storage_holder& operator=(storage_holder&& rhs) noexcept
		{
			if (&rhs == this) return *this;
			if (m_disk_io) m_disk_io->remove_torrent(m_idx);
			m_disk_io = rhs.m_disk_io;
			m_idx = rhs.m_idx;
			rhs.m_disk_io = nullptr;
			return *this;
		}